

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# settings.c
# Opt level: O3

char * gpps_raw(settings_r *sesskey,char *name,char *def)

{
  char *pcVar1;
  
  pcVar1 = read_setting_s(sesskey,name);
  if (pcVar1 == (char *)0x0) {
    pcVar1 = platform_default_s(name);
    if (pcVar1 == (char *)0x0) {
      if (def != (char *)0x0) {
        pcVar1 = dupstr(def);
        return pcVar1;
      }
      pcVar1 = (char *)0x0;
    }
  }
  return pcVar1;
}

Assistant:

static char *gpps_raw(settings_r *sesskey, const char *name, const char *def)
{
    char *ret = read_setting_s(sesskey, name);
    if (!ret)
        ret = platform_default_s(name);
    if (!ret)
        ret = def ? dupstr(def) : NULL;   /* permit NULL as final fallback */
    return ret;
}